

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Matrix<float,-1,1,0,-1,1>,1>::
applyThisOnTheLeft<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,1,_1,1,1,_1>>
          (HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>
           *this,Matrix<float,__1,__1,_0,__1,__1> *dst,Matrix<float,_1,__1,_1,_1,__1> *workspace,
          bool inputIsIdentity)

{
  PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *this_00;
  Matrix<float,_1,__1,_1,_1,__1> *pMVar1;
  Index IVar2;
  long *plVar3;
  Matrix<float,__1,__1,_0,__1,__1> *xpr;
  Index IVar4;
  long lVar5;
  long blockRows;
  Scalar *tau;
  Scalar *workspace_00;
  long blockCols;
  long local_258;
  long local_240;
  Index local_228;
  Index local_210;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  EssentialVectorType local_1b8;
  Type local_180;
  long local_148;
  Index dstStart_1;
  Index actual_k;
  Index k_1;
  undefined1 local_f8 [8];
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> sub_dst;
  Index dstRows;
  Index dstStart;
  type sub_vecs;
  SubVectorsType sub_vecs1;
  Index start;
  Index bs;
  long local_58;
  long local_50;
  Index k;
  long local_40;
  Index end;
  Index i;
  Index blockSize;
  PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *pPStack_20;
  bool inputIsIdentity_local;
  Matrix<float,_1,__1,_1,_1,__1> *workspace_local;
  Matrix<float,__1,__1,_0,__1,__1> *dst_local;
  HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
  *this_local;
  
  blockSize._7_1_ = inputIsIdentity;
  if ((inputIsIdentity) && (((byte)this[0x10] & 1) != 0)) {
    blockSize._7_1_ = 0;
  }
  pPStack_20 = &workspace->super_PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>;
  workspace_local = (Matrix<float,_1,__1,_1,_1,__1> *)dst;
  dst_local = (Matrix<float,__1,__1,_0,__1,__1> *)this;
  if ((*(long *)(this + 0x18) < 0x30) ||
     (IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>),
     IVar2 < 2)) {
    this_00 = pPStack_20;
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)workspace_local)
    ;
    PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>::resize(this_00,IVar2);
    for (actual_k = 0; actual_k < *(long *)(this + 0x18); actual_k = actual_k + 1) {
      if (((byte)this[0x10] & 1) == 0) {
        local_240 = (*(long *)(this + 0x18) - actual_k) + -1;
      }
      else {
        local_240 = actual_k;
      }
      dstStart_1 = local_240;
      IVar2 = HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
                      *)this);
      pMVar1 = workspace_local;
      lVar5 = (IVar2 - *(long *)(this + 0x20)) - dstStart_1;
      local_258 = lVar5;
      local_148 = lVar5;
      if ((blockSize._7_1_ & 1) == 0) {
        local_258 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                               workspace_local);
      }
      DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                (&local_180,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)pMVar1,lVar5,local_258)
      ;
      HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
      ::essentialVector(&local_1b8,
                        (HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
                         *)this,dstStart_1);
      tau = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::coeff
                      (*(PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> **)(this + 8),
                       dstStart_1);
      workspace_00 = PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>::data(pPStack_20);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,false>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>> *)
                 &local_180,&local_1b8,tau,workspace_00);
    }
  }
  else {
    if (*(long *)(this + 0x18) < 0x60) {
      local_1c8 = (*(long *)(this + 0x18) + 1) / 2;
    }
    else {
      local_1c8 = 0x30;
    }
    i = local_1c8;
    for (end = 0; end < *(long *)(this + 0x18); end = i + end) {
      if (((byte)this[0x10] & 1) == 0) {
        local_1d0 = *(long *)(this + 0x18) - end;
      }
      else {
        k = end + i;
        plVar3 = std::min<long>((long *)(this + 0x18),&k);
        local_1d0 = *plVar3;
      }
      local_40 = local_1d0;
      if (((byte)this[0x10] & 1) == 0) {
        local_58 = 0;
        bs = local_1d0 - i;
        plVar3 = std::max<long>(&local_58,&bs);
        local_1d8 = *plVar3;
      }
      else {
        local_1d8 = end;
      }
      local_50 = local_1d8;
      blockCols = local_40 - local_1d8;
      sub_vecs1.
      super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride = local_1d8 + *(long *)(this + 0x20);
      xpr = EigenBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                      (*(EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> **)this);
      lVar5 = local_50;
      IVar2 = sub_vecs1.
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride;
      IVar4 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        (*(PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> **)this);
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&sub_vecs,xpr,
                 IVar2,lVar5,
                 IVar4 - sub_vecs1.
                         super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .m_outerStride,blockCols);
      IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                         workspace_local);
      IVar4 = HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
                      *)this);
      lVar5 = (IVar2 - IVar4) + *(long *)(this + 0x20) + local_50;
      IVar2 = HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
                      *)this);
      pMVar1 = workspace_local;
      blockRows = (IVar2 - *(long *)(this + 0x20)) - local_50;
      local_210 = lVar5;
      if ((blockSize._7_1_ & 1) == 0) {
        local_210 = 0;
      }
      local_228 = blockRows;
      sub_dst.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride = blockRows;
      if ((blockSize._7_1_ & 1) == 0) {
        local_228 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                               workspace_local);
      }
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_f8,
                 (Matrix<float,__1,__1,_0,__1,__1> *)pMVar1,lVar5,local_210,blockRows,local_228);
      DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::segment<long>
                ((Type *)&k_1,*(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> **)(this + 8),
                 local_50,blockCols);
      internal::
      apply_block_householder_on_the_left<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>>
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_f8,
                 (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&sub_vecs,
                 (VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *)&k_1,
                 (bool)(((byte)this[0x10] ^ 0xff) & 1));
    }
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace, bool inputIsIdentity = false) const
    {
      if(inputIsIdentity && m_reverse)
        inputIsIdentity = false;
      // if the entries are large enough, then apply the reflectors by block
      if(m_length>=BlockSize && dst.cols()>1)
      {
        // Make sure we have at least 2 useful blocks, otherwise it is point-less:
        Index blockSize = m_length<Index(2*BlockSize) ? (m_length+1)/2 : Index(BlockSize);
        for(Index i = 0; i < m_length; i+=blockSize)
        {
          Index end = m_reverse ? (std::min)(m_length,i+blockSize) : m_length-i;
          Index k = m_reverse ? i : (std::max)(Index(0),end-blockSize);
          Index bs = end-k;
          Index start = k + m_shift;

          typedef Block<typename internal::remove_all<VectorsType>::type,Dynamic,Dynamic> SubVectorsType;
          SubVectorsType sub_vecs1(m_vectors.const_cast_derived(), Side==OnTheRight ? k : start,
                                                                   Side==OnTheRight ? start : k,
                                                                   Side==OnTheRight ? bs : m_vectors.rows()-start,
                                                                   Side==OnTheRight ? m_vectors.cols()-start : bs);
          typename internal::conditional<Side==OnTheRight, Transpose<SubVectorsType>, SubVectorsType&>::type sub_vecs(sub_vecs1);

          Index dstStart = dst.rows()-rows()+m_shift+k;
          Index dstRows  = rows()-m_shift-k;
          Block<Dest,Dynamic,Dynamic> sub_dst(dst,
                                              dstStart,
                                              inputIsIdentity ? dstStart : 0,
                                              dstRows,
                                              inputIsIdentity ? dstRows : dst.cols());
          apply_block_householder_on_the_left(sub_dst, sub_vecs, m_coeffs.segment(k, bs), !m_reverse);
        }
      }
      else
      {
        workspace.resize(dst.cols());
        for(Index k = 0; k < m_length; ++k)
        {
          Index actual_k = m_reverse ? k : m_length-k-1;
          Index dstStart = rows()-m_shift-actual_k;
          dst.bottomRightCorner(dstStart, inputIsIdentity ? dstStart : dst.cols())
            .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
        }
      }
    }